

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall re2::Compiler::Literal(Compiler *this,Rune r,bool foldcase)

{
  int iVar1;
  undefined8 in_RAX;
  Frag a;
  Frag b;
  long lVar2;
  ulong uVar3;
  Rune r_local;
  uint8_t buf [4];
  
  _r_local = CONCAT44(SUB84((ulong)in_RAX >> 0x20,0),r);
  if (this->encoding_ == kEncodingUTF8) {
    if (0x7f < r) {
      iVar1 = runetochar((char *)buf,&r_local);
      a = ByteRange(this,(uint)buf[0],(uint)buf[0],false);
      for (lVar2 = 1; lVar2 < iVar1; lVar2 = lVar2 + 1) {
        b = ByteRange(this,(uint)buf[lVar2],(uint)buf[lVar2],false);
        a = Cat(this,a,b);
      }
      uVar3 = (ulong)a & 0xffffffff00000000;
      goto LAB_001a9d60;
    }
    a = ByteRange(this,r,r,foldcase);
  }
  else {
    if (this->encoding_ != kEncodingLatin1) {
      uVar3 = 0;
      a.begin = 0;
      a.end.p = 0;
      goto LAB_001a9d60;
    }
    a = ByteRange(this,r,r,foldcase);
  }
  uVar3 = (ulong)a & 0xffffffff00000000;
LAB_001a9d60:
  return (Frag)((ulong)a & 0xffffffff | uVar3);
}

Assistant:

Frag Compiler::Literal(Rune r, bool foldcase) {
  switch (encoding_) {
    default:
      return Frag();

    case kEncodingLatin1:
      return ByteRange(r, r, foldcase);

    case kEncodingUTF8: {
      if (r < Runeself)  // Make common case fast.
        return ByteRange(r, r, foldcase);
      uint8_t buf[UTFmax];
      int n = runetochar(reinterpret_cast<char*>(buf), &r);
      Frag f = ByteRange((uint8_t)buf[0], buf[0], false);
      for (int i = 1; i < n; i++)
        f = Cat(f, ByteRange((uint8_t)buf[i], buf[i], false));
      return f;
    }
  }
}